

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

string * __thiscall
Catch::TestSpecParser::preprocessPattern_abi_cxx11_
          (string *__return_storage_ptr__,TestSpecParser *this)

{
  long *plVar1;
  pointer pcVar2;
  int iVar3;
  undefined8 *puVar4;
  pointer puVar5;
  pointer puVar6;
  ulong uVar7;
  ulong uVar8;
  bool bVar9;
  long *local_98;
  ulong local_90;
  long local_88;
  undefined8 uStack_80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_78;
  ulong *local_70;
  long local_68;
  ulong local_60 [2];
  ulong *local_50;
  long local_48;
  ulong local_40 [2];
  
  local_78 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_78;
  pcVar2 = (this->m_patternName)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar2,pcVar2 + (this->m_patternName)._M_string_length
            );
  puVar5 = (this->m_escapeChars).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start;
  puVar6 = (this->m_escapeChars).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (puVar6 != puVar5) {
    uVar7 = 0;
    do {
      std::__cxx11::string::substr((ulong)&local_50,(ulong)__return_storage_ptr__);
      std::__cxx11::string::substr((ulong)&local_70,(ulong)__return_storage_ptr__);
      uVar8 = 0xf;
      if (local_50 != local_40) {
        uVar8 = local_40[0];
      }
      if (uVar8 < (ulong)(local_68 + local_48)) {
        uVar8 = 0xf;
        if (local_70 != local_60) {
          uVar8 = local_60[0];
        }
        if (uVar8 < (ulong)(local_68 + local_48)) goto LAB_0012b159;
        puVar4 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_70,0,(char *)0x0,(ulong)local_50);
      }
      else {
LAB_0012b159:
        puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_50,(ulong)local_70);
      }
      plVar1 = puVar4 + 2;
      if ((long *)*puVar4 == plVar1) {
        local_88 = *plVar1;
        uStack_80 = puVar4[3];
        local_98 = &local_88;
      }
      else {
        local_88 = *plVar1;
        local_98 = (long *)*puVar4;
      }
      local_90 = puVar4[1];
      *puVar4 = plVar1;
      puVar4[1] = 0;
      *(undefined1 *)plVar1 = 0;
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_98);
      if (local_98 != &local_88) {
        operator_delete(local_98,local_88 + 1);
      }
      if (local_70 != local_60) {
        operator_delete(local_70,local_60[0] + 1);
      }
      if (local_50 != local_40) {
        operator_delete(local_50,local_40[0] + 1);
      }
      uVar7 = uVar7 + 1;
      puVar5 = (this->m_escapeChars).
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start;
      puVar6 = (this->m_escapeChars).
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish;
    } while (uVar7 < (ulong)((long)puVar6 - (long)puVar5 >> 3));
  }
  if (puVar6 != puVar5) {
    (this->m_escapeChars).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar5;
  }
  local_98 = &local_88;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"exclude:","");
  plVar1 = local_98;
  if (__return_storage_ptr__->_M_string_length < local_90) {
    bVar9 = false;
  }
  else if (local_90 == 0) {
    bVar9 = true;
  }
  else {
    iVar3 = bcmp(local_98,(__return_storage_ptr__->_M_dataplus)._M_p,local_90);
    bVar9 = iVar3 == 0;
  }
  if (plVar1 != &local_88) {
    operator_delete(plVar1,local_88 + 1);
  }
  if (bVar9) {
    this->m_exclusion = true;
    std::__cxx11::string::substr((ulong)&local_98,(ulong)__return_storage_ptr__);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_98);
    if (local_98 != &local_88) {
      operator_delete(local_98,local_88 + 1);
    }
  }
  (this->m_patternName)._M_string_length = 0;
  *(this->m_patternName)._M_dataplus._M_p = '\0';
  this->m_realPatternPos = 0;
  return __return_storage_ptr__;
}

Assistant:

std::string TestSpecParser::preprocessPattern() {
        std::string token = m_patternName;
        for (std::size_t i = 0; i < m_escapeChars.size(); ++i)
            token = token.substr(0, m_escapeChars[i] - i) + token.substr(m_escapeChars[i] - i + 1);
        m_escapeChars.clear();
        if (startsWith(token, "exclude:")) {
            m_exclusion = true;
            token = token.substr(8);
        }

        m_patternName.clear();
        m_realPatternPos = 0;

        return token;
    }